

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O1

void __thiscall
validation_layer::parameterValidationChecker::parameterValidationChecker
          (parameterValidationChecker *this)

{
  pointer *pppvVar1;
  iterator __position;
  int iVar2;
  char *__s2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  context_t *pcVar5;
  validationChecker *local_18;
  
  this->enableParameterValidation = false;
  __s2 = getenv("ZE_ENABLE_PARAMETER_VALIDATION");
  if ((__s2 == (char *)0x0) || (iVar2 = strcmp("0",__s2), iVar2 == 0)) {
    this->enableParameterValidation = false;
    return;
  }
  iVar2 = strcmp("1",__s2);
  this->enableParameterValidation = iVar2 == 0;
  if (iVar2 != 0) {
    return;
  }
  puVar3 = (undefined8 *)operator_new(8);
  *puVar3 = &PTR_zeInitPrologue_001fc768;
  puVar4 = (undefined8 *)operator_new(8);
  *puVar4 = &PTR_zesInitPrologue_001fd450;
  DAT_002015d8 = (undefined8 *)operator_new(8);
  *DAT_002015d8 = &PTR_zetModuleGetDebugInfoPrologue_001fddd8;
  parameterChecker = puVar3;
  DAT_002015d0 = puVar4;
  pcVar5 = context_t::getInstance();
  local_18 = (validationChecker *)&parameterChecker;
  __position._M_current =
       (pcVar5->validationHandlers).
       super__Vector_base<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (pcVar5->validationHandlers).
      super__Vector_base<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    *__position._M_current = (validationChecker *)&parameterChecker;
    pppvVar1 = &(pcVar5->validationHandlers).
                super__Vector_base<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
    return;
  }
  std::
  vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
  ::_M_realloc_insert<validation_layer::validationChecker*>
            ((vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
              *)&pcVar5->validationHandlers,__position,&local_18);
  return;
}

Assistant:

parameterValidationChecker::parameterValidationChecker() {
        enableParameterValidation = getenv_tobool( "ZE_ENABLE_PARAMETER_VALIDATION" );
        if(enableParameterValidation) {
            ZEParameterValidation *zeChecker = new ZEParameterValidation;
            ZESParameterValidation *zesChecker = new ZESParameterValidation;
            ZETParameterValidation *zetChecker = new ZETParameterValidation;
            parameterChecker.zeValidation = zeChecker;
            parameterChecker.zetValidation = zetChecker;
            parameterChecker.zesValidation = zesChecker;
            validation_layer::context.getInstance().validationHandlers.push_back(&parameterChecker);
        }
    }